

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::flip23(tetgenmesh *this,triface *fliptets,int hullflag,flipconstraints *fc)

{
  point pdVar1;
  tetrahedron p1;
  tetrahedron p0;
  tetrahedron p2;
  tetrahedron p1_00;
  tetrahedron p3;
  double dVar2;
  triface *local_168;
  triface *local_148;
  undefined1 local_140 [8];
  face checksh;
  face checkseg;
  double vol_diff;
  double volpos [3];
  double local_f8;
  double volneg [2];
  int i;
  int dummyflag;
  double volume;
  double attrib;
  point pe;
  point pd;
  point pc;
  point pb;
  point pa;
  triface casface;
  triface newface;
  triface botcastets [3];
  triface topcastets [3];
  flipconstraints *fc_local;
  int hullflag_local;
  triface *fliptets_local;
  tetgenmesh *this_local;
  
  local_148 = (triface *)&botcastets[2].ver;
  topcastets[2]._8_8_ = fc;
  do {
    triface::triface(local_148);
    local_148 = local_148 + 1;
  } while (local_148 != (triface *)&topcastets[2].ver);
  local_168 = (triface *)&newface.ver;
  do {
    triface::triface(local_168);
    local_168 = local_168 + 1;
  } while (local_168 != (triface *)&botcastets[2].ver);
  triface::triface((triface *)&casface.ver);
  triface::triface((triface *)&pa);
  volneg[1]._4_4_ = 0;
  if (0 < hullflag) {
    pdVar1 = oppo(this,fliptets + 1);
    if (pdVar1 == this->dummypoint) {
      triface::operator=((triface *)&casface.ver,fliptets);
      triface::operator=(fliptets,fliptets + 1);
      triface::operator=(fliptets + 1,(triface *)&casface.ver);
      volneg[1]._4_4_ = -1;
    }
    else {
      pdVar1 = org(this,fliptets);
      if (pdVar1 == this->dummypoint) {
        volneg[1]._4_4_ = 1;
        enextself(this,fliptets);
        eprevself(this,fliptets + 1);
      }
      else {
        pdVar1 = dest(this,fliptets);
        if (pdVar1 == this->dummypoint) {
          volneg[1]._4_4_ = 2;
          eprevself(this,fliptets);
          enextself(this,fliptets + 1);
        }
        else {
          volneg[1]._4_4_ = 0;
        }
      }
    }
  }
  p1 = (tetrahedron)org(this,fliptets);
  p0 = (tetrahedron)dest(this,fliptets);
  p2 = (tetrahedron)apex(this,fliptets);
  p1_00 = (tetrahedron)oppo(this,fliptets);
  p3 = (tetrahedron)oppo(this,fliptets + 1);
  this->flip23count = this->flip23count + 1;
  for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
    fnext(this,fliptets,(triface *)&botcastets[(long)volneg[1]._0_4_ + 2].ver);
    enextself(this,fliptets);
  }
  for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
    fnext(this,fliptets + 1,(triface *)&botcastets[(long)volneg[1]._0_4_ + -1].ver);
    eprevself(this,fliptets + 1);
  }
  fliptets->ver = 0xb;
  fliptets[1].ver = 0xb;
  setelemmarker(this,fliptets->tet,0);
  setelemmarker(this,fliptets[1].tet,0);
  if (this->checksubsegflag != 0) {
    if (fliptets->tet[8] != (tetrahedron)0x0) {
      memorypool::dealloc(this->tet2segpool,fliptets->tet[8]);
      fliptets->tet[8] = (tetrahedron)0x0;
    }
    if (fliptets[1].tet[8] != (tetrahedron)0x0) {
      memorypool::dealloc(this->tet2segpool,fliptets[1].tet[8]);
      fliptets[1].tet[8] = (tetrahedron)0x0;
    }
  }
  if (this->checksubfaceflag != 0) {
    if (fliptets->tet[9] != (tetrahedron)0x0) {
      memorypool::dealloc(this->tet2subpool,fliptets->tet[9]);
      fliptets->tet[9] = (tetrahedron)0x0;
    }
    if (fliptets[1].tet[9] != (tetrahedron)0x0) {
      memorypool::dealloc(this->tet2subpool,fliptets[1].tet[9]);
      fliptets[1].tet[9] = (tetrahedron)0x0;
    }
  }
  maketetrahedron(this,fliptets + 2);
  for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < this->numelemattrib;
      volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
    dVar2 = elemattribute(this,fliptets->tet,volneg[1]._0_4_);
    setelemattribute(this,fliptets[2].tet,volneg[1]._0_4_,dVar2);
  }
  if (this->b->varvolume != 0) {
    dVar2 = volumebound(this,fliptets->tet);
    setvolumebound(this,fliptets[2].tet,dVar2);
  }
  if (hullflag < 1) {
    fliptets->tet[orgpivot[fliptets->ver]] = p3;
    fliptets->tet[destpivot[fliptets->ver]] = p1_00;
    fliptets->tet[apexpivot[fliptets->ver]] = p1;
    fliptets->tet[oppopivot[fliptets->ver]] = p0;
    fliptets[1].tet[orgpivot[fliptets[1].ver]] = p3;
    fliptets[1].tet[destpivot[fliptets[1].ver]] = p1_00;
    fliptets[1].tet[apexpivot[fliptets[1].ver]] = p0;
    fliptets[1].tet[oppopivot[fliptets[1].ver]] = p2;
    fliptets[2].tet[orgpivot[fliptets[2].ver]] = p3;
    fliptets[2].tet[destpivot[fliptets[2].ver]] = p1_00;
    fliptets[2].tet[apexpivot[fliptets[2].ver]] = p2;
    fliptets[2].tet[oppopivot[fliptets[2].ver]] = p1;
  }
  else if (p1_00 == (tetrahedron)this->dummypoint) {
    fliptets->tet[orgpivot[fliptets->ver]] = p1;
    fliptets->tet[destpivot[fliptets->ver]] = p0;
    fliptets->tet[apexpivot[fliptets->ver]] = p3;
    fliptets->tet[oppopivot[fliptets->ver]] = p1_00;
    fliptets[1].tet[orgpivot[fliptets[1].ver]] = p0;
    fliptets[1].tet[destpivot[fliptets[1].ver]] = p2;
    fliptets[1].tet[apexpivot[fliptets[1].ver]] = p3;
    fliptets[1].tet[oppopivot[fliptets[1].ver]] = p1_00;
    fliptets[2].tet[orgpivot[fliptets[2].ver]] = p2;
    fliptets[2].tet[destpivot[fliptets[2].ver]] = p1;
    fliptets[2].tet[apexpivot[fliptets[2].ver]] = p3;
    fliptets[2].tet[oppopivot[fliptets[2].ver]] = p1_00;
    for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
      eprevesymself(this,fliptets + volneg[1]._0_4_);
      enextself(this,fliptets + volneg[1]._0_4_);
    }
    this->hullsize = this->hullsize + 2;
  }
  else {
    fliptets->tet[orgpivot[fliptets->ver]] = p3;
    fliptets->tet[destpivot[fliptets->ver]] = p1_00;
    fliptets->tet[apexpivot[fliptets->ver]] = p1;
    fliptets->tet[oppopivot[fliptets->ver]] = p0;
    fliptets[1].tet[orgpivot[fliptets[1].ver]] = p3;
    fliptets[1].tet[destpivot[fliptets[1].ver]] = p1_00;
    fliptets[1].tet[apexpivot[fliptets[1].ver]] = p0;
    fliptets[1].tet[oppopivot[fliptets[1].ver]] = p2;
    if (p2 == (tetrahedron)this->dummypoint) {
      fliptets[2].tet[orgpivot[fliptets[2].ver]] = p1_00;
      fliptets[2].tet[destpivot[fliptets[2].ver]] = p3;
      fliptets[2].tet[apexpivot[fliptets[2].ver]] = p1;
      fliptets[2].tet[oppopivot[fliptets[2].ver]] = p2;
      esymself(this,fliptets + 2);
    }
    else {
      fliptets[2].tet[orgpivot[fliptets[2].ver]] = p3;
      fliptets[2].tet[destpivot[fliptets[2].ver]] = p1_00;
      fliptets[2].tet[apexpivot[fliptets[2].ver]] = p2;
      fliptets[2].tet[oppopivot[fliptets[2].ver]] = p1;
    }
  }
  if (*(int *)(topcastets[2]._8_8_ + 0x14) != 0) {
    if (p1_00 == (tetrahedron)this->dummypoint) {
      vol_diff = 0.0;
      volpos[0] = 0.0;
      volpos[1] = 0.0;
      local_f8 = 0.0;
      volneg[0] = tetprismvol(this,(double *)p0,(double *)p1,(double *)p2,(double *)p3);
    }
    else if (p2 == (tetrahedron)this->dummypoint) {
      vol_diff = tetprismvol(this,(double *)p3,(double *)p1_00,(double *)p1,(double *)p0);
      volpos[0] = 0.0;
      volpos[1] = 0.0;
      local_f8 = 0.0;
      volneg[0] = 0.0;
    }
    else {
      vol_diff = tetprismvol(this,(double *)p3,(double *)p1_00,(double *)p1,(double *)p0);
      volpos[0] = tetprismvol(this,(double *)p3,(double *)p1_00,(double *)p0,(double *)p2);
      volpos[1] = tetprismvol(this,(double *)p3,(double *)p1_00,(double *)p2,(double *)p1);
      local_f8 = tetprismvol(this,(double *)p1,(double *)p0,(double *)p2,(double *)p1_00);
      volneg[0] = tetprismvol(this,(double *)p0,(double *)p1,(double *)p2,(double *)p3);
    }
    *(double *)(topcastets[2]._8_8_ + 0x20) =
         (((vol_diff + volpos[0] + volpos[1]) - local_f8) - volneg[0]) +
         *(double *)(topcastets[2]._8_8_ + 0x20);
  }
  for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
    esym(this,fliptets + volneg[1]._0_4_,(triface *)&casface.ver);
    bond(this,(triface *)&casface.ver,fliptets + (volneg[1]._0_4_ + 1) % 3);
  }
  for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
    eorgoppo(this,fliptets + volneg[1]._0_4_,(triface *)&casface.ver);
    bond(this,(triface *)&casface.ver,(triface *)&botcastets[(long)volneg[1]._0_4_ + 2].ver);
  }
  for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
    edestoppo(this,fliptets + volneg[1]._0_4_,(triface *)&casface.ver);
    bond(this,(triface *)&casface.ver,(triface *)&botcastets[(long)volneg[1]._0_4_ + -1].ver);
  }
  if (this->checksubsegflag != 0) {
    face::face((face *)&checksh.shver);
    for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
      if ((*(long *)(*(long *)&botcastets[(long)volneg[1]._0_4_ + 2].ver + 0x40) != 0) &&
         (*(long *)(*(long *)(*(long *)&botcastets[(long)volneg[1]._0_4_ + 2].ver + 0x40) +
                   (long)ver2edge[*(int *)&topcastets[volneg[1]._0_4_].tet] * 8) != 0)) {
        tsspivot1(this,(triface *)&botcastets[(long)volneg[1]._0_4_ + 2].ver,(face *)&checksh.shver)
        ;
        eorgoppo(this,fliptets + volneg[1]._0_4_,(triface *)&casface.ver);
        tssbond1(this,(triface *)&casface.ver,(face *)&checksh.shver);
        sstbond1(this,(face *)&checksh.shver,(triface *)&casface.ver);
        if ((*(uint *)(topcastets[2]._8_8_ + 4) & 1) != 0) {
          enqueuesubface(this,this->badsubsegs,(face *)&checksh.shver);
        }
      }
    }
    for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
      eprev(this,(triface *)&botcastets[(long)volneg[1]._0_4_ + 2].ver,(triface *)&pa);
      if ((pa[8] != 0.0) && (*(long *)((long)pa[8] + (long)ver2edge[(int)casface.tet] * 8) != 0)) {
        tsspivot1(this,(triface *)&pa,(face *)&checksh.shver);
        enext(this,fliptets + volneg[1]._0_4_,(triface *)&casface.ver);
        tssbond1(this,(triface *)&casface.ver,(face *)&checksh.shver);
        sstbond1(this,(face *)&checksh.shver,(triface *)&casface.ver);
        esym(this,fliptets + (volneg[1]._0_4_ + 2) % 3,(triface *)&casface.ver);
        eprevself(this,(triface *)&casface.ver);
        tssbond1(this,(triface *)&casface.ver,(face *)&checksh.shver);
        sstbond1(this,(face *)&checksh.shver,(triface *)&casface.ver);
        if ((*(uint *)(topcastets[2]._8_8_ + 4) & 1) != 0) {
          enqueuesubface(this,this->badsubsegs,(face *)&checksh.shver);
        }
      }
    }
    for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
      enext(this,(triface *)&botcastets[(long)volneg[1]._0_4_ + -1].ver,(triface *)&pa);
      if ((pa[8] != 0.0) && (*(long *)((long)pa[8] + (long)ver2edge[(int)casface.tet] * 8) != 0)) {
        tsspivot1(this,(triface *)&pa,(face *)&checksh.shver);
        eprev(this,fliptets + volneg[1]._0_4_,(triface *)&casface.ver);
        tssbond1(this,(triface *)&casface.ver,(face *)&checksh.shver);
        sstbond1(this,(face *)&checksh.shver,(triface *)&casface.ver);
        esym(this,fliptets + (volneg[1]._0_4_ + 2) % 3,(triface *)&casface.ver);
        enextself(this,(triface *)&casface.ver);
        tssbond1(this,(triface *)&casface.ver,(face *)&checksh.shver);
        sstbond1(this,(face *)&checksh.shver,(triface *)&casface.ver);
        if ((*(uint *)(topcastets[2]._8_8_ + 4) & 1) != 0) {
          enqueuesubface(this,this->badsubsegs,(face *)&checksh.shver);
        }
      }
    }
  }
  if (this->checksubfaceflag != 0) {
    face::face((face *)local_140);
    for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
      if ((*(long *)(*(long *)&botcastets[(long)volneg[1]._0_4_ + 2].ver + 0x48) != 0) &&
         (*(long *)(*(long *)(*(long *)&botcastets[(long)volneg[1]._0_4_ + 2].ver + 0x48) +
                   (long)(int)(*(uint *)&topcastets[volneg[1]._0_4_].tet & 3) * 8) != 0)) {
        tspivot(this,(triface *)&botcastets[(long)volneg[1]._0_4_ + 2].ver,(face *)local_140);
        eorgoppo(this,fliptets + volneg[1]._0_4_,(triface *)&casface.ver);
        sesymself(this,(face *)local_140);
        tsbond(this,(triface *)&casface.ver,(face *)local_140);
        if ((*(uint *)(topcastets[2]._8_8_ + 4) & 2) != 0) {
          enqueuesubface(this,this->badsubfacs,(face *)local_140);
        }
      }
    }
    for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
      if ((*(long *)(*(long *)&botcastets[(long)volneg[1]._0_4_ + -1].ver + 0x48) != 0) &&
         (*(long *)(*(long *)(*(long *)&botcastets[(long)volneg[1]._0_4_ + -1].ver + 0x48) +
                   (long)(int)(*(uint *)&botcastets[volneg[1]._0_4_].tet & 3) * 8) != 0)) {
        tspivot(this,(triface *)&botcastets[(long)volneg[1]._0_4_ + -1].ver,(face *)local_140);
        edestoppo(this,fliptets + volneg[1]._0_4_,(triface *)&casface.ver);
        sesymself(this,(face *)local_140);
        tsbond(this,(triface *)&casface.ver,(face *)local_140);
        if ((*(uint *)(topcastets[2]._8_8_ + 4) & 2) != 0) {
          enqueuesubface(this,this->badsubfacs,(face *)local_140);
        }
      }
    }
  }
  if ((*(uint *)(topcastets[2]._8_8_ + 4) & 4) != 0) {
    for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
      enqueuetetrahedron(this,fliptets + volneg[1]._0_4_);
    }
  }
  setpoint2tet(this,(point)p1,(tetrahedron)fliptets->tet);
  setpoint2tet(this,(point)p0,(tetrahedron)fliptets->tet);
  setpoint2tet(this,(point)p2,(tetrahedron)fliptets[1].tet);
  setpoint2tet(this,(point)p1_00,(tetrahedron)fliptets->tet);
  setpoint2tet(this,(point)p3,(tetrahedron)fliptets->tet);
  if ((0 < hullflag) && (volneg[1]._4_4_ != 0)) {
    if (volneg[1]._4_4_ == -1) {
      for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
        esymself(this,fliptets + volneg[1]._0_4_);
      }
      triface::operator=((triface *)&casface.ver,fliptets + 1);
      triface::operator=(fliptets + 1,fliptets + 2);
      triface::operator=(fliptets + 2,(triface *)&casface.ver);
    }
    else if (volneg[1]._4_4_ == 1) {
      triface::operator=((triface *)&casface.ver,fliptets);
      triface::operator=(fliptets,fliptets + 2);
      triface::operator=(fliptets + 2,fliptets + 1);
      triface::operator=(fliptets + 1,(triface *)&casface.ver);
    }
    else {
      triface::operator=((triface *)&casface.ver,fliptets);
      triface::operator=(fliptets,fliptets + 1);
      triface::operator=(fliptets + 1,fliptets + 2);
      triface::operator=(fliptets + 2,(triface *)&casface.ver);
    }
  }
  if (0 < *(int *)topcastets[2]._8_8_) {
    for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
      eprevesym(this,fliptets + volneg[1]._0_4_,(triface *)&casface.ver);
      flippush(this,&this->flipstack,(triface *)&casface.ver);
    }
    if (1 < *(int *)topcastets[2]._8_8_) {
      for (volneg[1]._0_4_ = 0; volneg[1]._0_4_ < 3; volneg[1]._0_4_ = volneg[1]._0_4_ + 1) {
        enextesym(this,fliptets + volneg[1]._0_4_,(triface *)&casface.ver);
        flippush(this,&this->flipstack,(triface *)&casface.ver);
      }
    }
  }
  triface::operator=(&this->recenttet,fliptets);
  return;
}

Assistant:

void tetgenmesh::flip23(triface* fliptets, int hullflag, flipconstraints *fc)
{
  triface topcastets[3], botcastets[3];
  triface newface, casface;
  point pa, pb, pc, pd, pe;
  REAL attrib, volume;
  int dummyflag = 0;  // range = {-1, 0, 1, 2}.
  int i;

  if (hullflag > 0) {
    // Check if e is dummypoint.
    if (oppo(fliptets[1]) == dummypoint) {
      // Swap the two old tets.
      newface = fliptets[0];
      fliptets[0] = fliptets[1];
      fliptets[1] = newface;
      dummyflag = -1;  // d is dummypoint.
    } else {
      // Check if either a or b is dummypoint.
      if (org(fliptets[0]) == dummypoint) {
        dummyflag = 1; // a is dummypoint.
        enextself(fliptets[0]);
        eprevself(fliptets[1]);
      } else if (dest(fliptets[0]) == dummypoint) {
        dummyflag = 2; // b is dummypoint.
        eprevself(fliptets[0]);
        enextself(fliptets[1]);
      } else {
        dummyflag = 0; // either c or d may be dummypoint.
      }
    }
  }

  pa =  org(fliptets[0]);
  pb = dest(fliptets[0]);
  pc = apex(fliptets[0]);
  pd = oppo(fliptets[0]);
  pe = oppo(fliptets[1]);

  flip23count++;

  // Get the outer boundary faces.
  for (i = 0; i < 3; i++) {
    fnext(fliptets[0], topcastets[i]);
    enextself(fliptets[0]);
  }
  for (i = 0; i < 3; i++) {
    fnext(fliptets[1], botcastets[i]);
    eprevself(fliptets[1]);
  }

  // Re-use fliptets[0] and fliptets[1].
  fliptets[0].ver = 11;
  fliptets[1].ver = 11;
  setelemmarker(fliptets[0].tet, 0); // Clear all flags.
  setelemmarker(fliptets[1].tet, 0);
  // NOTE: the element attributes and volume constraint remain unchanged.
  if (checksubsegflag) {
    // Dealloc the space to subsegments.
    if (fliptets[0].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[0].tet[8]);
      fliptets[0].tet[8] = NULL;
    }
    if (fliptets[1].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[1].tet[8]);
      fliptets[1].tet[8] = NULL;
    }
  }
  if (checksubfaceflag) {
    // Dealloc the space to subfaces.
    if (fliptets[0].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[0].tet[9]);
      fliptets[0].tet[9] = NULL;
    }
    if (fliptets[1].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[1].tet[9]);
      fliptets[1].tet[9] = NULL;
    }
  }
  // Create a new tet.
  maketetrahedron(&(fliptets[2]));
  // The new tet have the same attributes from the old tet.
  for (i = 0; i < numelemattrib; i++) {
    attrib = elemattribute(fliptets[0].tet, i);
    setelemattribute(fliptets[2].tet, i, attrib);
  }
  if (b->varvolume) {
    volume = volumebound(fliptets[0].tet);
    setvolumebound(fliptets[2].tet, volume);
  }

  if (hullflag > 0) {
    // Check if d is dummytet.
    if (pd != dummypoint) {
      setvertices(fliptets[0], pe, pd, pa, pb); // [e,d,a,b] *
      setvertices(fliptets[1], pe, pd, pb, pc); // [e,d,b,c] *
      // Check if c is dummypoint.
      if (pc != dummypoint) {
        setvertices(fliptets[2], pe, pd, pc, pa);  // [e,d,c,a] *
      } else {
        setvertices(fliptets[2], pd, pe, pa, pc); // [d,e,a,c]
        esymself(fliptets[2]);                    // [e,d,c,a] *
      }
      // The hullsize does not change.
    } else {
      // d is dummypoint.
      setvertices(fliptets[0], pa, pb, pe, pd); // [a,b,e,d]
      setvertices(fliptets[1], pb, pc, pe, pd); // [b,c,e,d]
      setvertices(fliptets[2], pc, pa, pe, pd); // [c,a,e,d]
      // Adjust the faces to [e,d,a,b], [e,d,b,c], [e,d,c,a] *
      for (i = 0; i < 3; i++) {
        eprevesymself(fliptets[i]);
        enextself(fliptets[i]);
      }
      // We deleted one hull tet, and created three hull tets.
      hullsize += 2;
    }
  } else {
    setvertices(fliptets[0], pe, pd, pa, pb); // [e,d,a,b] *
    setvertices(fliptets[1], pe, pd, pb, pc); // [e,d,b,c] *
    setvertices(fliptets[2], pe, pd, pc, pa); // [e,d,c,a] *
  }

  if (fc->remove_ndelaunay_edge) { // calc_tetprism_vol
    REAL volneg[2], volpos[3], vol_diff;
    if (pd != dummypoint) {
      if (pc != dummypoint) {
        volpos[0] = tetprismvol(pe, pd, pa, pb);
        volpos[1] = tetprismvol(pe, pd, pb, pc);
        volpos[2] = tetprismvol(pe, pd, pc, pa);
        volneg[0] = tetprismvol(pa, pb, pc, pd);
        volneg[1] = tetprismvol(pb, pa, pc, pe);
      } else { // pc == dummypoint
        volpos[0] = tetprismvol(pe, pd, pa, pb);
        volpos[1] = 0.;
        volpos[2] = 0.;
        volneg[0] = 0.;
        volneg[1] = 0.;
      }
    } else { // pd == dummypoint.
      volpos[0] = 0.;
      volpos[1] = 0.;
      volpos[2] = 0.;
      volneg[0] = 0.;
      volneg[1] = tetprismvol(pb, pa, pc, pe);
    }
    vol_diff = volpos[0] + volpos[1] + volpos[2] - volneg[0] - volneg[1];
    fc->tetprism_vol_sum  += vol_diff; // Update the total sum.
  }

  // Bond three new tets together.
  for (i = 0; i < 3; i++) {
    esym(fliptets[i], newface);
    bond(newface, fliptets[(i + 1) % 3]);
  }
  // Bond to top outer boundary faces (at [a,b,c,d]).
  for (i = 0; i < 3; i++) {
    eorgoppo(fliptets[i], newface); // At edges [b,a], [c,b], [a,c].
    bond(newface, topcastets[i]);
  }
  // Bond bottom outer boundary faces (at [b,a,c,e]).
  for (i = 0; i < 3; i++) {
    edestoppo(fliptets[i], newface); // At edges [a,b], [b,c], [c,a].
    bond(newface, botcastets[i]);
  }

  if (checksubsegflag) {
    // Bond subsegments if there are.
    // Each new tet has 5 edges to be checked (except the edge [e,d]). 
    face checkseg;
    // The middle three: [a,b], [b,c], [c,a].
    for (i = 0; i < 3; i++) {      
      if (issubseg(topcastets[i])) {
        tsspivot1(topcastets[i], checkseg);
        eorgoppo(fliptets[i], newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
    }
    // The top three: [d,a], [d,b], [d,c]. Two tets per edge.
    for (i = 0; i < 3; i++) {
      eprev(topcastets[i], casface);      
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        enext(fliptets[i], newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        esym(fliptets[(i + 2) % 3], newface);
        eprevself(newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
    }
    // The bot three: [a,e], [b,e], [c,e]. Two tets per edge.
    for (i = 0; i < 3; i++) {
      enext(botcastets[i], casface);
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        eprev(fliptets[i], newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        esym(fliptets[(i + 2) % 3], newface);
        enextself(newface);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
    }
  } // if (checksubsegflag)

  if (checksubfaceflag) {
    // Bond 6 subfaces if there are.
    face checksh;
    for (i = 0; i < 3; i++) {      
      if (issubface(topcastets[i])) {
        tspivot(topcastets[i], checksh);
        eorgoppo(fliptets[i], newface);
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
    }
    for (i = 0; i < 3; i++) {
      if (issubface(botcastets[i])) {
        tspivot(botcastets[i], checksh);
        edestoppo(fliptets[i], newface);
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
    }
  } // if (checksubfaceflag)

  if (fc->chkencflag & 4) {
    // Put three new tets into check list.
    for (i = 0; i < 3; i++) {
      enqueuetetrahedron(&(fliptets[i]));
    }
  }

  // Update the point-to-tet map.
  setpoint2tet(pa, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pb, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pc, (tetrahedron) fliptets[1].tet);
  setpoint2tet(pd, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pe, (tetrahedron) fliptets[0].tet);

  if (hullflag > 0) {
    if (dummyflag != 0) {
      // Restore the original position of the points (for flipnm()).
      if (dummyflag == -1) { 
        // Reverse the edge.
        for (i = 0; i < 3; i++) {
          esymself(fliptets[i]);
        }
        // Swap the last two new tets.
        newface = fliptets[1];
        fliptets[1] = fliptets[2];
        fliptets[2] = newface;
      } else {
        // either a or b were swapped.
        if (dummyflag == 1) {
          // a is dummypoint.
          newface = fliptets[0];
          fliptets[0] = fliptets[2];
          fliptets[2] = fliptets[1];
          fliptets[1] = newface;
        } else { // dummyflag == 2
          // b is dummypoint.
          newface = fliptets[0];
          fliptets[0] = fliptets[1];
          fliptets[1] = fliptets[2];
          fliptets[2] = newface;
        }
      }
    }
  }

  if (fc->enqflag > 0) {
    // Queue faces which may be locally non-Delaunay.  
    for (i = 0; i < 3; i++) {
      eprevesym(fliptets[i], newface);
      flippush(flipstack, &newface);
    }
    if (fc->enqflag > 1) {
      for (i = 0; i < 3; i++) {
        enextesym(fliptets[i], newface);
        flippush(flipstack, &newface);
      }
    }
  }

  recenttet = fliptets[0];
}